

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qppmhandler.cpp
# Opt level: O0

QRgb scale_pbm_color(quint16 mx,quint16 rv,quint16 gv,quint16 bv)

{
  uint uVar1;
  long in_FS_OFFSET;
  quint16 in_stack_ffffffffffffffd8;
  quint16 in_stack_ffffffffffffffda;
  QRgba64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = QRgba64::fromRgba64(0,0,in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8);
  uVar1 = QRgba64::toArgb32(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

static inline QRgb scale_pbm_color(quint16 mx, quint16 rv, quint16 gv, quint16 bv)
{
    return QRgba64::fromRgba64((rv * 0xffffu) / mx, (gv * 0xffffu) / mx, (bv * 0xffffu) / mx, 0xffff).toArgb32();
}